

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_parser.cpp
# Opt level: O0

bool __thiscall
Iso9660Parser::read_sectors_raw(Iso9660Parser *this,void *buf,int isosec,int numsects,bool decrypt)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  bool decrypt_local;
  int numsects_local;
  int isosec_local;
  void *buf_local;
  Iso9660Parser *this_local;
  
  __stream = (FILE *)this->f;
  iVar1 = isoToPhysical(this,isosec);
  fseek(__stream,(long)(iVar1 * this->sectorSize),0);
  sVar3 = fread(buf,(long)this->sectorSize,(long)numsects,(FILE *)this->f);
  if (sVar3 == (long)numsects) {
    if ((decrypt) && (this->key != (uchar *)0x0)) {
      iVar1 = isoToLogical(this,isosec);
      DecryptSectors(buf,iVar1,numsects,this->sectorSize,this->key,this->keyLen);
    }
    this_local._7_1_ = true;
  }
  else {
    uVar2 = isoToPhysical(this,isosec);
    printf("read error for sector %d\n",(ulong)uVar2);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Iso9660Parser::read_sectors_raw(void* buf, int isosec, int numsects, bool decrypt)
{
  fseek(f, isoToPhysical(isosec)*sectorSize, SEEK_SET);
  if ( fread(buf, sectorSize, numsects, f) != numsects )
  {
    printf("read error for sector %d\n", isoToPhysical(isosec));
    return false;
  }
  if ( decrypt && key != NULL )
    DecryptSectors(buf, isoToLogical(isosec), numsects, sectorSize, key, keyLen);
  return true;
}